

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusinternalfilters.cpp
# Opt level: O3

QDBusMessage
propertyWriteReply(QDBusMessage *msg,QString *interface_name,QByteArray *property_name,int status)

{
  QDBusMessage QVar1;
  uint in_R9D;
  
  QVar1.d_ptr = (QDBusMessagePrivate *)
                (*(code *)(&DAT_00198db0 + *(int *)(&DAT_00198db0 + (ulong)in_R9D * 4)))();
  return (QDBusMessage)QVar1.d_ptr;
}

Assistant:

static QDBusMessage propertyWriteReply(const QDBusMessage &msg, const QString &interface_name,
                                       const QByteArray &property_name, int status)
{
    switch (status) {
    case PropertyNotFound:
        return propertyNotFoundError(msg, interface_name, property_name);
    case PropertyTypeMismatch:
        return msg.createErrorReply(QDBusError::InvalidArgs,
                                    "Invalid arguments for writing to property %1%2%3"_L1
                                    .arg(interface_name,
                                         interface_name.isEmpty() ? ""_L1 : "."_L1,
                                         QLatin1StringView(property_name)));
    case PropertyReadOnly:
        return msg.createErrorReply(QDBusError::PropertyReadOnly,
                                    "Property %1%2%3 is read-only"_L1
                                    .arg(interface_name,
                                         interface_name.isEmpty() ? ""_L1 : "."_L1,
                                         QLatin1StringView(property_name)));
    case PropertyWriteFailed:
        return msg.createErrorReply(QDBusError::InternalError,
                                    QString::fromLatin1("Internal error"));

    case PropertyWriteSuccess:
        return msg.createReply();
    }
    Q_ASSERT_X(false, "", "Should not be reached");
    return QDBusMessage();
}